

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O2

void TPZBuildMultiphysicsMesh::TransferFromMeshesT<std::complex<double>>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  int iVar1;
  complex<double> *pcVar2;
  undefined8 uVar3;
  int iVar4;
  TPZFMatrix<std::complex<double>_> *pTVar5;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  TPZConnect *pTVar7;
  int64_t iVar8;
  TPZSubCompMesh *this;
  long lVar9;
  int64_t iVar10;
  TPZCompEl *pTVar11;
  TPZCompMesh *pTVar12;
  long lVar13;
  int iVar14;
  int r;
  int64_t el;
  int iVar15;
  long lVar16;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  complex<double> getval;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01816478;
  local_68.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_68.fNElements = 0;
  local_68.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_68);
  iVar10 = local_68.fNElements;
  pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  lVar13 = 0;
  if (iVar10 < 1) {
    iVar10 = lVar13;
  }
  do {
    if (lVar13 == iVar10) {
      this = (TPZSubCompMesh *)
             __dynamic_cast(MFMesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
      if (this != (TPZSubCompMesh *)0x0) {
        lVar13 = (**(code **)(*(long *)&this->super_TPZCompMesh + 0x98))(this);
        pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                           ((TPZSolutionMatrix *)(lVar13 + 0x370));
        iVar4 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x90))();
        iVar14 = 0;
        if (iVar4 < 1) {
          iVar4 = iVar14;
        }
        for (; iVar14 != iVar4; iVar14 = iVar14 + 1) {
          lVar9 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa0))
                            (&this->super_TPZCompEl,iVar14);
          iVar10 = TPZSubCompMesh::InternalIndex(this,lVar9);
          if (lVar9 == -1) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                       ,0x169);
          }
          TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)(lVar13 + 0x370));
          pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                             ((TPZChunkVector<TPZConnect,_10> *)(lVar13 + 0x158),lVar9);
          lVar9 = pTVar7->fSequenceNumber;
          lVar16 = (long)(int)lVar9 * 0x10;
          iVar15 = *(int *)(*(long *)(lVar13 + 0x5f0) + 0xc + lVar16);
          pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                             (&(this->super_TPZCompMesh).fSolution);
          pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                             (&(this->super_TPZCompMesh).fConnectVec.
                               super_TPZChunkVector<TPZConnect,_10>,iVar10);
          iVar10 = pTVar7->fSequenceNumber;
          if (lVar9 < 0) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                       ,0x177);
          }
          r = 0;
          if (iVar15 < 1) {
            iVar15 = 0;
            r = 0;
          }
          for (; iVar15 != r; r = r + 1) {
            iVar1 = *(int *)(*(long *)(lVar13 + 0x5f0) + 8 + lVar16);
            iVar8 = TPZBlock::Index(&(this->super_TPZCompMesh).fBlock,iVar10,r);
            pcVar2 = pTVar5->fElem;
            uVar3 = *(undefined8 *)(pTVar6->fElem[iVar8]._M_value + 8);
            *(undefined8 *)pcVar2[iVar1 + r]._M_value = *(undefined8 *)pTVar6->fElem[iVar8]._M_value
            ;
            *(undefined8 *)(pcVar2[iVar1 + r]._M_value + 8) = uVar3;
          }
        }
      }
      lVar13 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      lVar9 = 0;
      if (lVar13 < 1) {
        lVar13 = lVar9;
      }
      for (; lVar13 != lVar9; lVar9 = lVar9 + 1) {
        pTVar11 = TPZCompMesh::Element(MFMesh,lVar9);
        if ((pTVar11 != (TPZCompEl *)0x0) &&
           (pTVar12 = (TPZCompMesh *)
                      __dynamic_cast(pTVar11,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918),
           pTVar12 != (TPZCompMesh *)0x0)) {
          TransferFromMeshes(cmeshVec,pTVar12);
        }
      }
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec(&local_68);
      return;
    }
    pTVar12 = local_68.fStore[lVar13].first;
    if (pTVar12 != (TPZCompMesh *)0x0) {
      pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar12->fSolution);
      pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar12->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          local_68.fStore[lVar13].second);
      lVar9 = pTVar7->fSequenceNumber;
      if (lVar9 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x14e);
      }
      iVar4 = (pTVar12->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)lVar9].dim;
      pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar13);
      lVar16 = pTVar7->fSequenceNumber;
      if (lVar16 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x152);
      }
      iVar14 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
        iVar14 = 0;
      }
      for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
        iVar8 = TPZBlock::Index(&pTVar12->fBlock,lVar9,iVar14);
        local_48 = *(undefined8 *)pTVar6->fElem[iVar8]._M_value;
        uStack_40 = *(undefined8 *)(pTVar6->fElem[iVar8]._M_value + 8);
        iVar8 = TPZBlock::Index(&MFMesh->fBlock,lVar16,iVar14);
        pcVar2 = pTVar5->fElem;
        *(undefined8 *)pcVar2[iVar8]._M_value = local_48;
        *(undefined8 *)(pcVar2[iVar8]._M_value + 8) = uStack_40;
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMeshesT(TPZVec<TPZCompMesh *> &cmeshVec,
                                                   TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        if(!atomic_mesh) continue;
		TPZBlock &block = atomic_mesh->Block();
        TPZFMatrix<TVar> &sol = atomic_mesh->Solution();
        TPZConnect &con = atomic_mesh->ConnectVec()[indexes[connect].second];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            auto getval = sol(block.Index(seqnum, idf));
            solMF(blockMF.Index(seqnumMF, idf)) = getval;
        }
	}
    
    
    // copy the solution of the submesh to father mesh
    if(1)
    {
        TPZSubCompMesh *msub = dynamic_cast<TPZSubCompMesh*>(MFMesh);
        if(msub){
            TPZCompMesh * fathermesh = msub->FatherMesh();
            //TODOCOMPLEX
            TPZFMatrix<TVar> &fathermeshSol = fathermesh->Solution();
            TPZCompEl *compel = dynamic_cast<TPZCompEl*>(msub);
            int nconnect = compel->NConnects();
            
            for(int ic=0; ic<nconnect ; ic++){
                
                int64_t fatherconIndex = compel->ConnectIndex(ic);
                int64_t submeshIndex = msub->InternalIndex(fatherconIndex);
                if(fatherconIndex == -1) DebugStop();
                //acessing the block on father mesh
                TPZBlock &blockfather = fathermesh->Block();
                TPZFMatrix<TVar> &solfather = fathermesh->Solution();
                
                TPZConnect &confather = fathermesh->ConnectVec()[fatherconIndex];
                int64_t seqnumfather = confather.SequenceNumber();
                int nblock = blockfather.Size(seqnumfather);
                //acessing the block on submesh
                TPZBlock &blocksub = msub->Block();
                TPZFMatrix<TVar> &solsub = ((TPZCompMesh *)(msub))->Solution();
                const TPZConnect &consub = msub->ConnectVec()[submeshIndex];
                const int64_t seqnumsub = consub.SequenceNumber();
                
                if(seqnumfather < 0) DebugStop();
                for(int idf=0 ; idf<nblock; idf++){
                    const int posfather = blockfather.Position(seqnumfather);
                    auto valsub = solsub(blocksub.Index(seqnumsub, idf));
                    fathermeshSol(posfather + idf) = valsub;
                }
            }
            
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMeshes(cmeshVec, sub);
        }
    }
}